

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

BailOutInstrTemplate<IR::Instr> *
IR::BailOutInstrTemplate<IR::Instr>::New
          (OpCode opcode,BailOutKind kind,Instr *bailOutTarget,Func *func)

{
  code *pcVar1;
  bool bVar2;
  uint32 bailOutOffset;
  undefined4 *puVar3;
  BailOutInfo *this;
  BailOutInstrTemplate<IR::Instr> *pBVar4;
  
  if (bailOutTarget->m_func != func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x596,"(func == bailOutTarget->m_func)","func == bailOutTarget->m_func");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,func->m_alloc,0x3f1274);
  bailOutOffset = Instr::GetByteCodeOffset(bailOutTarget);
  BailOutInfo::BailOutInfo(this,bailOutOffset,func);
  this->bailOutOpcode = opcode;
  pBVar4 = New(opcode,kind,this,func);
  return pBVar4;
}

Assistant:

BailOutInstrTemplate<InstrType> *
BailOutInstrTemplate<InstrType>::New(Js::OpCode opcode, BailOutKind kind, IR::Instr * bailOutTarget, Func * func)
{
    Assert(func == bailOutTarget->m_func);
    BailOutInfo * bailOutInfo = JitAnew(func->m_alloc, BailOutInfo, bailOutTarget->GetByteCodeOffset(), func);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    bailOutInfo->bailOutOpcode = opcode;
#endif
    return BailOutInstrTemplate::New(opcode, kind, bailOutInfo, func);
}